

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printArithExtend(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  AArch64_AM_ShiftExtendType ST;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  MCOperand *pMVar5;
  int64_t iVar6;
  char *pcVar7;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  arm64_extender ext;
  uint Src1;
  uint Dest;
  uint ShiftVal;
  AArch64_AM_ShiftExtendType ExtType;
  uint Val;
  undefined4 in_stack_ffffffffffffffb8;
  int32_t in_stack_ffffffffffffffbc;
  SStream *in_stack_ffffffffffffffc0;
  undefined4 local_30;
  
  pMVar5 = MCInst_getOperand(in_RDI,in_ESI);
  iVar6 = MCOperand_getImm(pMVar5);
  ST = AArch64_AM_getArithExtendType(0);
  uVar2 = AArch64_AM_getArithShiftValue((uint)iVar6);
  if ((ST == AArch64_AM_UXTW) || (ST == AArch64_AM_UXTX)) {
    pMVar5 = MCInst_getOperand(in_RDI,0);
    uVar3 = MCOperand_getReg(pMVar5);
    pMVar5 = MCInst_getOperand(in_RDI,1);
    uVar4 = MCOperand_getReg(pMVar5);
    if ((((uVar3 == 4) || (uVar4 == 4)) && (ST == AArch64_AM_UXTX)) ||
       (((uVar3 == 5 || (uVar4 == 5)) && (ST == AArch64_AM_UXTW)))) {
      if (uVar2 == 0) {
        return;
      }
      SStream_concat0(in_stack_ffffffffffffffc0,
                      (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      printInt32Bang(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      if (in_RDI->csh->detail == CS_OPT_OFF) {
        return;
      }
      puVar1 = in_RDI->flat_insn->detail->groups +
               (long)(int)((in_RDI->flat_insn->detail->field_6).x86.opcode[2] - 1) * 0x38 + 0x21;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(uint *)(in_RDI->flat_insn->detail->groups +
               (long)(int)((in_RDI->flat_insn->detail->field_6).x86.opcode[2] - 1) * 0x38 + 0x25) =
           uVar2;
      return;
    }
  }
  pcVar7 = AArch64_AM_getShiftExtendName(ST);
  SStream_concat(in_RDX,", %s",pcVar7);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    in_stack_ffffffffffffffc0 = (SStream *)(ulong)(uint)(ST + ~AArch64_AM_MSL);
    switch(in_stack_ffffffffffffffc0) {
    default:
      local_30 = 1;
      break;
    case (SStream *)0x1:
      local_30 = 2;
      break;
    case (SStream *)0x2:
      local_30 = 3;
      break;
    case (SStream *)0x3:
      local_30 = 4;
      break;
    case (SStream *)0x4:
      local_30 = 5;
      break;
    case (SStream *)0x5:
      local_30 = 6;
      break;
    case (SStream *)0x6:
      local_30 = 7;
      break;
    case (SStream *)0x7:
      local_30 = 8;
    }
    *(undefined4 *)
     (in_RDI->flat_insn->detail->groups +
     (long)(int)((in_RDI->flat_insn->detail->field_6).x86.opcode[2] - 1) * 0x38 + 0x29) = local_30;
  }
  if (uVar2 != 0) {
    SStream_concat0(in_stack_ffffffffffffffc0,
                    (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    printInt32Bang(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      puVar1 = in_RDI->flat_insn->detail->groups +
               (long)(int)((in_RDI->flat_insn->detail->field_6).x86.opcode[2] - 1) * 0x38 + 0x21;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(uint *)(in_RDI->flat_insn->detail->groups +
               (long)(int)((in_RDI->flat_insn->detail->field_6).x86.opcode[2] - 1) * 0x38 + 0x25) =
           uVar2;
    }
  }
  return;
}

Assistant:

static void printArithExtend(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned Val = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	AArch64_AM_ShiftExtendType ExtType = AArch64_AM_getArithExtendType(Val);
	unsigned ShiftVal = AArch64_AM_getArithShiftValue(Val);

	// If the destination or first source register operand is [W]SP, print
	// UXTW/UXTX as LSL, and if the shift amount is also zero, print nothing at
	// all.
	if (ExtType == AArch64_AM_UXTW || ExtType == AArch64_AM_UXTX) {
		unsigned Dest = MCOperand_getReg(MCInst_getOperand(MI, 0));
		unsigned Src1 = MCOperand_getReg(MCInst_getOperand(MI, 1));
		if ( ((Dest == AArch64_SP || Src1 == AArch64_SP) &&
					ExtType == AArch64_AM_UXTX) ||
				((Dest == AArch64_WSP || Src1 == AArch64_WSP) &&
				 ExtType == AArch64_AM_UXTW) ) {
			if (ShiftVal != 0) {
				SStream_concat0(O, ", lsl ");
				printInt32Bang(O, ShiftVal);
				if (MI->csh->detail) {
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.type = ARM64_SFT_LSL;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.value = ShiftVal;
				}
			}

			return;
		}
	}

	SStream_concat(O, ", %s", AArch64_AM_getShiftExtendName(ExtType));
	if (MI->csh->detail) {
		arm64_extender ext = ARM64_EXT_INVALID;
		switch(ExtType) {
			default:	// never reach
			case AArch64_AM_UXTB:
				ext = ARM64_EXT_UXTB;
				break;
			case AArch64_AM_UXTH:
				ext = ARM64_EXT_UXTH;
				break;
			case AArch64_AM_UXTW:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_UXTX:
				ext = ARM64_EXT_UXTX;
				break;
			case AArch64_AM_SXTB:
				ext = ARM64_EXT_SXTB;
				break;
			case AArch64_AM_SXTH:
				ext = ARM64_EXT_SXTH;
				break;
			case AArch64_AM_SXTW:
				ext = ARM64_EXT_SXTW;
				break;
			case AArch64_AM_SXTX:
				ext = ARM64_EXT_SXTX;
				break;
		}

		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].ext = ext;
	}

	if (ShiftVal != 0) {
		SStream_concat0(O, " ");
		printInt32Bang(O, ShiftVal);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.type = ARM64_SFT_LSL;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.value = ShiftVal;
		}
	}
}